

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WatWriter
          (WatWriter *this,Stream *stream,WriteWatOptions *options,Module *module)

{
  vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_> *local_30;
  Module *module_local;
  WriteWatOptions *options_local;
  Stream *stream_local;
  WatWriter *this_local;
  
  ModuleContext::ModuleContext(&this->super_ModuleContext,module);
  this->options_ = options;
  this->stream_ = stream;
  Result::Result(&this->result_,Ok);
  this->indent_ = 0;
  this->next_char_ = None;
  std::
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ::vector(&this->expr_tree_stack_);
  std::
  multimap<std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*,_std::less<std::pair<wabt::ExternalKind,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>_>
  ::multimap(&this->inline_export_map_);
  local_30 = this->inline_import_map_;
  do {
    std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::vector(local_30);
    local_30 = local_30 + 1;
  } while (local_30 !=
           (vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_> *)&this->func_index_
          );
  this->func_index_ = 0;
  this->global_index_ = 0;
  this->table_index_ = 0;
  this->memory_index_ = 0;
  this->type_index_ = 0;
  this->tag_index_ = 0;
  this->data_segment_index_ = 0;
  this->elem_segment_index_ = 0;
  return;
}

Assistant:

WatWriter(Stream* stream,
            const WriteWatOptions& options,
            const Module& module)
      : ModuleContext(module), options_(options), stream_(stream) {}